

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

size_t __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
GetNonEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this,
          bool checkCount)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  Recycler *pRVar2;
  RecyclerSweepManager *pRVar3;
  undefined4 *puVar4;
  code *pcVar5;
  bool bVar6;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *in_FS_OFFSET;
  
  pSVar7 = this->fullBlockList;
  lVar9 = 0;
  while (pSVar7 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar7 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar7 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
    }
    lVar9 = lVar9 + 1;
  }
  pSVar7 = this->heapBlockList;
  lVar10 = 0;
  while (pSVar7 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      pSVar7 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar7 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
    }
    lVar10 = lVar10 + 1;
  }
  uVar11 = lVar10 + lVar9;
  pRVar2 = ((this->super_HeapBucket).heapInfo)->recycler;
  if ((pRVar2 != (Recycler *)0x0) &&
     (pRVar3 = pRVar2->recyclerSweepManager, pRVar3 != (RecyclerSweepManager *)0x0)) {
    sVar8 = RecyclerSweep::
            GetHeapBlockCount<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                      (&pRVar3->defaultHeapRecyclerSweep,this);
    uVar11 = uVar11 + sVar8;
  }
  if ((checkCount) && (uVar11 != (this->super_HeapBucket).heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1cc,
                       "(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  return uVar11;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = HeapBlockList::Count(fullBlockList);
    currentHeapBlockCount += HeapBlockList::Count(heapBlockList);
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        allocatingDuringConcurrentSweep = true;
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
        if (allocableHeapBlockListHead != nullptr)
        {
            currentHeapBlockCount += QueryDepthInterlockedSList(allocableHeapBlockListHead);
        }
        currentHeapBlockCount += HeapBlockList::Count(sweepableHeapBlockList);
        debugSweepableHeapBlockListLock.Leave();
    }
#endif
#endif

    // Recycler can be null if we have OOM in the ctor
    if (this->GetRecycler() && this->GetRecycler()->recyclerSweepManager != nullptr)
    {
        currentHeapBlockCount += this->GetRecycler()->recyclerSweepManager->GetHeapBlockCount(this);
    }
#endif

    // There is no way to determine the number of item in an SLIST if there are >= 65535 items in the list.
    RECYCLER_SLOW_CHECK(Assert(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));

    return currentHeapBlockCount;
}